

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  Which WVar1;
  Which WVar2;
  uint uVar3;
  uint uVar4;
  uint64_t scopeId;
  uint64_t replacementScopeId;
  Reader local_2e0;
  Reader local_2b0;
  Reader local_280;
  Reader local_250;
  Reader local_220;
  Reader local_1f0;
  Reader local_1c0;
  Reader local_190;
  Reader local_160;
  Reader local_130;
  Reader local_f8;
  Reader local_c8;
  Reader local_98;
  Reader local_68;
  Fault local_28;
  Fault f;
  Reader *replacement_local;
  Reader *node_local;
  CompatibilityChecker *this_local;
  
  f.exception = (Exception *)replacement;
  WVar1 = capnp::schema::Node::Reader::which(node);
  WVar2 = capnp::schema::Node::Reader::which((Reader *)f.exception);
  if (WVar1 == WVar2) {
    capnp::schema::Node::Reader::getParameters(&local_68,(Reader *)f.exception);
    uVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_68);
    capnp::schema::Node::Reader::getParameters(&local_98,node);
    uVar4 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_98);
    if (uVar4 < uVar3) {
      replacementIsNewer(this);
    }
    else {
      capnp::schema::Node::Reader::getParameters(&local_c8,(Reader *)f.exception);
      uVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_c8);
      capnp::schema::Node::Reader::getParameters(&local_f8,node);
      uVar4 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_f8);
      if (uVar3 < uVar4) {
        replacementIsOlder(this);
      }
    }
    WVar1 = capnp::schema::Node::Reader::which(node);
    switch(WVar1) {
    case FILE:
      capnp::schema::Node::Reader::getFile(node);
      verifyVoid();
      break;
    case STRUCT:
      capnp::schema::Node::Reader::getStruct(&local_130,node);
      capnp::schema::Node::Reader::getStruct(&local_160,(Reader *)f.exception);
      scopeId = capnp::schema::Node::Reader::getScopeId(node);
      replacementScopeId = capnp::schema::Node::Reader::getScopeId((Reader *)f.exception);
      checkCompatibility(this,&local_130,&local_160,scopeId,replacementScopeId);
      break;
    case ENUM:
      capnp::schema::Node::Reader::getEnum(&local_190,node);
      capnp::schema::Node::Reader::getEnum(&local_1c0,(Reader *)f.exception);
      checkCompatibility(this,&local_190,&local_1c0);
      break;
    case INTERFACE:
      capnp::schema::Node::Reader::getInterface(&local_1f0,node);
      capnp::schema::Node::Reader::getInterface(&local_220,(Reader *)f.exception);
      checkCompatibility(this,&local_1f0,&local_220);
      break;
    case CONST:
      capnp::schema::Node::Reader::getConst(&local_250,node);
      capnp::schema::Node::Reader::getConst(&local_280,(Reader *)f.exception);
      checkCompatibility(this,&local_250,&local_280);
      break;
    case ANNOTATION:
      capnp::schema::Node::Reader::getAnnotation(&local_2b0,node);
      capnp::schema::Node::Reader::getAnnotation(&local_2e0,(Reader *)f.exception);
      checkCompatibility(this,&local_2b0,&local_2e0);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x2be,FAILED,"node.which() == replacement.which()","\"kind of declaration changed\""
               ,(char (*) [28])"kind of declaration changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_28);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }